

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::binaryByComponent<double,_double,_int>::call
          (binaryByComponent<double,_double,_int> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  uint uVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  ulong uVar6;
  ulong uVar7;
  GLuint component;
  ulong uVar8;
  undefined8 uVar9;
  
  GVar3 = GPUShaderFP64Test10::functionObject::getArgumentOffset((functionObject *)this,1);
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,0);
  GVar5 = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,1);
  uVar2 = GVar5;
  if (GVar5 < GVar4) {
    uVar2 = GVar4;
  }
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
    uVar6 = uVar8;
    if (GVar4 == 1) {
      uVar6 = 0;
    }
    uVar7 = uVar8;
    if (GVar5 == 1) {
      uVar7 = 0;
    }
    uVar9 = (*pcVar1)(*(undefined8 *)((long)argument_src + uVar6 * 8),
                      *(undefined4 *)((long)argument_src + uVar7 * 4 + (ulong)GVar3));
    *(undefined8 *)((long)result_dst + uVar8 * 8) = uVar9;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT*  p_result = (ResT*)result_dst;
		Arg1T* p_arg_1  = (Arg1T*)argument_src;
		Arg2T* p_arg_2  = (Arg2T*)((glw::GLubyte*)argument_src + getArgumentOffset(1));

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getArgumentComponents(1);
		const glw::GLuint n_components   = de::max(n_components_0, n_components_1);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const Arg1T first_arg  = p_arg_1[component * component_step_0];
			const Arg2T second_arg = p_arg_2[component * component_step_1];

			p_result[component] = p_function(first_arg, second_arg);
		}
	}